

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartInputFile.cpp
# Opt level: O3

void __thiscall Imf_2_5::MultiPartInputFile::Data::~Data(Data *this)

{
  IStream *pIVar1;
  InputPartData *this_00;
  pointer puVar2;
  pointer ppIVar3;
  ulong uVar4;
  
  if ((this->deleteStream == true) &&
     (pIVar1 = (this->super_InputStreamMutex).is, pIVar1 != (IStream *)0x0)) {
    (*pIVar1->_vptr_IStream[1])();
  }
  ppIVar3 = (this->parts).
            super__Vector_base<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->parts).
      super__Vector_base<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppIVar3) {
    uVar4 = 0;
    do {
      this_00 = ppIVar3[uVar4];
      if (this_00 != (InputPartData *)0x0) {
        puVar2 = (this_00->chunkOffsets).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (puVar2 != (pointer)0x0) {
          operator_delete(puVar2,(long)(this_00->chunkOffsets).
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)puVar2);
        }
        Header::~Header(&this_00->header);
      }
      operator_delete(this_00,0x70);
      uVar4 = uVar4 + 1;
      ppIVar3 = (this->parts).
                super__Vector_base<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(this->parts).
                                   super__Vector_base<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar3 >> 3))
    ;
  }
  std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::~vector(&this->_headers);
  std::
  _Rb_tree<int,_std::pair<const_int,_Imf_2_5::GenericInputFile_*>,_std::_Select1st<std::pair<const_int,_Imf_2_5::GenericInputFile_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Imf_2_5::GenericInputFile_*>_>_>
  ::~_Rb_tree(&(this->_inputFiles)._M_t);
  ppIVar3 = (this->parts).
            super__Vector_base<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppIVar3 != (pointer)0x0) {
    operator_delete(ppIVar3,(long)(this->parts).
                                  super__Vector_base<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppIVar3
                   );
    return;
  }
  return;
}

Assistant:

~Data()
    {
        if (deleteStream) delete is;

        for (size_t i = 0; i < parts.size(); i++)
            delete parts[i];
    }